

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::SingleLineUnboundLayoutBoxEqualsSumOfAdvances(LayoutTests *this)

{
  long lVar1;
  allocator local_2fd;
  float local_2fc;
  string local_2f8;
  box_r box4;
  richtext_t local_2d0;
  factory_ptr f1;
  layout l4;
  factory_ptr f2;
  box_r box5;
  box_r box3;
  box_r box2;
  box_r box1;
  layout l5;
  layout l3;
  layout l2;
  layout l1;
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_98;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char_to_index indices2 [3];
  char_to_index indices1 [3];
  
  indices1[0].symbol = 0x41;
  indices1[0].index = 1;
  indices1[1].symbol = 0x42;
  indices1[1].index = 0;
  indices1[2].symbol = 0x51;
  indices1[2].index = 0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x402a000000000000;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0x4026000000000000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  create_single_font_factory<3ul,2ul>
            ((LayoutTests *)&f1,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [2])indices1);
  layout::layout(&l1);
  layout::layout(&l2);
  layout::layout(&l3);
  std::__cxx11::string::string((string *)&l4,"A",(allocator *)&l5);
  R(&local_2d0,(string *)&l4);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l1,&local_2d0,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2d0);
  std::__cxx11::string::~string((string *)&l4);
  std::__cxx11::string::string((string *)&l4,"AAB",(allocator *)&l5);
  R(&local_2d0,(string *)&l4);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l2,&local_2d0,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2d0);
  std::__cxx11::string::~string((string *)&l4);
  std::__cxx11::string::string((string *)&l4,"BQA",(allocator *)&l5);
  R(&local_2d0,(string *)&l4);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l3,&local_2d0,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2d0);
  std::__cxx11::string::~string((string *)&l4);
  box1 = l1._box;
  box2 = l2._box;
  box3 = l3._box;
  l5._glyphs._begin._0_4_ = 0x41300000;
  std::__cxx11::string::string
            ((string *)&l4,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)&local_2f8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2d0,(string *)&l4,0x5e);
  ut::are_equal<float,float>((float *)&l5,&box1.w,(LocationInfo *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&l4);
  l5._glyphs._begin._0_4_ = 0x420c0000;
  std::__cxx11::string::string
            ((string *)&l4,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)&local_2f8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2d0,(string *)&l4,0x5f);
  ut::are_equal<float,float>((float *)&l5,&box2.w,(LocationInfo *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&l4);
  l5._glyphs._begin._0_4_ = 0x42140000;
  std::__cxx11::string::string
            ((string *)&l4,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)&local_2f8);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2d0,(string *)&l4,0x60);
  ut::are_equal<float,float>((float *)&l5,&box3.w,(LocationInfo *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&l4);
  indices2[0].symbol = 0x41;
  indices2[0].index = 0;
  indices2[1].symbol = 0x42;
  indices2[1].index = 0;
  indices2[2].symbol = 0x51;
  indices2[2].index = 0;
  create_single_font_factory<3ul,2ul>
            ((LayoutTests *)&f2,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [2])indices2);
  layout::layout(&l4);
  layout::layout(&l5);
  std::__cxx11::string::string((string *)&local_2f8,"A",(allocator *)&box4);
  R(&local_2d0,&local_2f8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l4,&local_2d0,
             f2.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_2f8,"ABQABQABQ",(allocator *)&box4);
  R(&local_2d0,&local_2f8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l5,&local_2d0,
             f2.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f8);
  box4 = l4._box;
  box5 = l5._box;
  local_2fc = 13.0;
  std::__cxx11::string::string
            ((string *)&local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_2fd);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2d0,&local_2f8,0x72);
  ut::are_equal<float,float>(&local_2fc,&box4.w,(LocationInfo *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f8);
  local_2fc = 117.0;
  std::__cxx11::string::string
            ((string *)&local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_2fd);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2d0,&local_2f8,0x73);
  ut::are_equal<float,float>(&local_2fc,&box5.w,(LocationInfo *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f8);
  layout::~layout(&l5);
  layout::~layout(&l4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f2.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  layout::~layout(&l3);
  layout::~layout(&l2);
  layout::~layout(&l1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f1.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar1 = 0x38;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_98._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( SingleLineUnboundLayoutBoxEqualsSumOfAdvances )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);

				// ACT
				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(11.0f, box1.w);
				assert_equal(35.0f, box2.w);
				assert_equal(37.0f, box3.w);

				// INIT
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 0 }, { L'Q', 0 }, };
				factory_ptr f2 = create_single_font_factory(c_fm1, indices2, glyphs);

				// INIT / ACT
				layout l4;
				layout l5;

				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQABQABQ"), limit::none(), *f2);

				// ACT
				box_r box4 = l4.get_box();
				box_r box5 = l5.get_box();

				// ASSERT
				assert_equal(13.0f, box4.w);
				assert_equal(117.0f, box5.w);
			}